

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

executor * __thiscall
spdlog::logger::log_<char_const(&)[4],char_const(&)[10]>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,char (*args) [4],
          char (*args_1) [10])

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  char *s;
  size_t count;
  char (*in_RCX) [10];
  executor *in_RDI;
  undefined8 in_R8;
  v8 *in_R9;
  undefined8 in_stack_00000008;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  logger *in_stack_00000018;
  char (*in_stack_00000020) [4];
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  logger *in_stack_fffffffffffffba8;
  level_enum in_stack_fffffffffffffc0c;
  log_msg *in_stack_fffffffffffffc10;
  string_view_t in_stack_fffffffffffffc18;
  string_view_t in_stack_fffffffffffffc28;
  source_loc in_stack_fffffffffffffc40;
  basic_string_view<char> local_368 [2];
  buffer<char> *in_stack_fffffffffffffcb8;
  locale_ref in_stack_fffffffffffffcc0;
  unsigned_long_long in_stack_fffffffffffffcc8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_stack_fffffffffffffcd0;
  basic_string_view<char> in_stack_fffffffffffffcd8;
  locale_ref local_2c0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[4],_char[10]>
  local_2b8;
  undefined8 local_298;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[4],_char[10]>
  *local_290;
  char (*local_288) [10];
  undefined8 uStack_280;
  allocator<char> local_261;
  buffer<char> local_260 [9];
  undefined1 local_13a;
  byte local_139;
  v8 *local_138;
  char (*local_120) [10];
  undefined8 uStack_118;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[4],_char[10]>
  *local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[4],_char[10]>
  *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[4],_char[10]>
  *local_8;
  
  local_138 = in_R9;
  local_120 = in_RCX;
  uStack_118 = in_R8;
  local_139 = should_log(in_stack_fffffffffffffba8,
                         (level_enum)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  local_13a = details::backtracer::enabled((backtracer *)0x13b428);
  if (((local_139 & 1) != 0) || ((bool)local_13a)) {
    std::allocator<char>::allocator();
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffba0,(allocator<char> *)in_stack_fffffffffffffb98);
    std::allocator<char>::~allocator(&local_261);
    local_288 = local_120;
    uStack_280 = uStack_118;
    ::fmt::v8::
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char[4],char[10]>
              (&local_2b8,local_138,in_stack_00000020,in_RCX);
    local_28 = &local_298;
    local_30 = &local_2b8;
    local_18 = 0xcc;
    local_298 = 0xcc;
    local_20 = local_30;
    local_10 = local_28;
    local_8 = local_30;
    local_290 = local_30;
    ::fmt::v8::detail::locale_ref::locale_ref(&local_2c0);
    args_00.field_1.values_ = in_stack_fffffffffffffcd0.values_;
    args_00.desc_ = in_stack_fffffffffffffcc8;
    ::fmt::v8::detail::vformat_to<char>
              (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcd8,args_00,in_stack_fffffffffffffcc0
              );
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    s = ::fmt::v8::detail::buffer<char>::data(local_260);
    count = ::fmt::v8::detail::buffer<char>::size(local_260);
    ::fmt::v8::basic_string_view<char>::basic_string_view(local_368,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc40,in_stack_fffffffffffffc28,
               in_stack_fffffffffffffc0c,in_stack_fffffffffffffc18);
    log_it_(in_stack_00000018,(log_msg *)in_stack_00000010,
            SUB21((ushort)in_stack_00000008._6_2_ >> 8,0),SUB21(in_stack_00000008._6_2_,0));
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (in_stack_00000010);
  }
  else {
    details::executor::executor(in_RDI);
  }
  return in_RDI;
}

Assistant:

SPDLOG_EXECUTOR_T log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return SPDLOG_EXECUTOR_T{};
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(args...));
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            return log_it_(log_msg, log_enabled, traceback_enabled);
        }